

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

bool xercesc_4_0::XMLUri::isWellFormedIPv4Address(XMLCh *addr,XMLSize_t length)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  uVar4 = 0;
  if (length != 0) {
    uVar5 = 1;
    bVar7 = false;
    iVar6 = 0;
    do {
      uVar3 = uVar4;
      if (addr[uVar5 - 1] == L'.') {
        if ((uVar5 == 1) || ((uVar5 == length || (bVar2 = XMLString::isDigit(addr[uVar5]), !bVar2)))
           ) break;
        uVar3 = uVar4 + 1;
        iVar6 = 0;
        if (2 < (int)uVar4) break;
      }
      else {
        bVar2 = XMLString::isDigit(addr[uVar5 - 1]);
        if ((2 < iVar6) || (!bVar2)) break;
        iVar6 = iVar6 + 1;
        if (iVar6 == 3) {
          iVar6 = 3;
          if ((0x31 < (ushort)addr[uVar5 - 3]) &&
             ((addr[uVar5 - 3] != L'2' ||
              ((0x34 < (ushort)addr[uVar5 - 2] &&
               ((addr[uVar5 - 2] != L'5' || (0x35 < (ushort)addr[uVar5 - 1])))))))) break;
        }
      }
      bVar7 = length <= uVar5;
      lVar1 = uVar5 + 1;
      uVar5 = uVar5 + 1;
      uVar4 = uVar3;
    } while (lVar1 - length != 1);
    uVar4 = (uint)(byte)(uVar3 == 3 & bVar7);
  }
  return SUB41(uVar4,0);
}

Assistant:

bool XMLUri::isWellFormedIPv4Address(const XMLCh* const addr, const XMLSize_t length)
{
    int numDots = 0;
    int numDigits = 0;

    // IPv4address = 1*3DIGIT "." 1*3DIGIT "." 1*3DIGIT "." 1*3DIGIT
    //
    // make sure that
    // 1) we see only digits and dot separators,
    // 2) that any dot separator is preceded and followed by a digit
    // 3) that we find 3 dots
    // 4) that each segment contains 1 to 3 digits.
    // 5) that each segment is not greater than 255.
    for (XMLSize_t i = 0; i < length; ++i)
    {
        if (addr[i] == chPeriod)
        {
            if ((i == 0) ||
                (i+1 == length) ||
                !XMLString::isDigit(addr[i+1]))
            {
               return false;
            }
            numDigits = 0;
            if (++numDots > 3)
                return false;
        }
        else if (!XMLString::isDigit(addr[i]))
        {
            return false;
        }
        // Check that that there are no more than three digits
        // in this segment.
        else if (++numDigits > 3)
        {
            return false;
        }
        // Check that this segment is not greater than 255.
        else if (numDigits == 3)
        {
            XMLCh first = addr[i-2];
            XMLCh second = addr[i-1];
            XMLCh last = addr[i];
            if (!(first < chDigit_2 ||
                 (first == chDigit_2 &&
                 (second < chDigit_5 ||
                 (second == chDigit_5 && last <= chDigit_5)))))
            {
                return false;
            }
        }
    } //for
    return (numDots == 3);
}